

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O0

void __thiscall Tank::validate(Tank *this,Network *nw)

{
  Curve *this_00;
  int iVar1;
  NetworkError *pNVar2;
  double *pdVar3;
  double dVar4;
  string local_98 [32];
  double local_78;
  double tankHead;
  string local_68 [35];
  undefined1 local_45;
  string local_38 [32];
  Network *local_18;
  Network *nw_local;
  Tank *this_local;
  
  local_18 = nw;
  nw_local = (Network *)this;
  if (((this->diameter == 0.0) && (!NAN(this->diameter))) && (this->volCurve == (Curve *)0x0)) {
    local_45 = 1;
    pNVar2 = (NetworkError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_38,(string *)&(this->super_Node).super_Element.name);
    NetworkError::NetworkError(pNVar2,7,(string *)local_38);
    local_45 = 0;
    __cxa_throw(pNVar2,&NetworkError::typeinfo,NetworkError::~NetworkError);
  }
  if (this->volCurve != (Curve *)0x0) {
    iVar1 = Curve::size(this->volCurve);
    if (iVar1 < 2) {
      tankHead._7_1_ = 1;
      pNVar2 = (NetworkError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_68,(string *)&(this->super_Node).super_Element.name);
      NetworkError::NetworkError(pNVar2,7,(string *)local_68);
      tankHead._7_1_ = 0;
      __cxa_throw(pNVar2,&NetworkError::typeinfo,NetworkError::~NetworkError);
    }
    dVar4 = Curve::x(this->volCurve,0);
    local_78 = dVar4 / this->ucfLength + (this->super_Node).elev;
    pdVar3 = std::max<double>(&this->minHead,&local_78);
    this->minHead = *pdVar3;
    this_00 = this->volCurve;
    iVar1 = Curve::size(this->volCurve);
    dVar4 = Curve::x(this_00,iVar1 + -1);
    local_78 = dVar4 / this->ucfLength + (this->super_Node).elev;
    pdVar3 = std::min<double>(&this->maxHead,&local_78);
    this->maxHead = *pdVar3;
  }
  if (this->maxHead < this->minHead) {
    pNVar2 = (NetworkError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_98,(string *)&(this->super_Node).super_Element.name);
    NetworkError::NetworkError(pNVar2,3,(string *)local_98);
    __cxa_throw(pNVar2,&NetworkError::typeinfo,NetworkError::~NetworkError);
  }
  pdVar3 = std::max<double>(&this->initHead,&this->minHead);
  this->initHead = *pdVar3;
  pdVar3 = std::min<double>(&this->initHead,&this->maxHead);
  this->initHead = *pdVar3;
  return;
}

Assistant:

void Tank::validate(Network* nw)
{
    // ... check for enough info to compute volume
    if ( diameter == 0.0 && volCurve == nullptr )
    {
        throw NetworkError(NetworkError::INVALID_VOLUME_CURVE, name);
    }

    // ... check that volume curve (depth v. volume in user units)
    //     covers range of depth limits
    if ( volCurve )
    {
        if ( volCurve->size() < 2 )
        {
            throw NetworkError(NetworkError::INVALID_VOLUME_CURVE, name);
        }
        double tankHead = volCurve->x(0) / ucfLength + elev;
        minHead = max(minHead, tankHead);
        tankHead = volCurve->x(volCurve->size() - 1) / ucfLength + elev;
        maxHead = min(maxHead, tankHead);
     }

    // ... check for consistent depth limits
    if ( maxHead < minHead )
    {
        throw NetworkError(NetworkError::INVALID_TANK_LEVELS, name);
    }
    initHead = max(initHead, minHead);
    initHead = min(initHead, maxHead);
}